

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  int iVar1;
  code *pcVar2;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  secp256k1_fe t;
  secp256k1_fe r;
  secp256k1_fe l;
  secp256k1_fe *in_stack_ffffffffffffff68;
  secp256k1_fe *in_stack_ffffffffffffff70;
  secp256k1_fe local_68;
  secp256k1_fe local_40;
  int local_14;
  void *local_10;
  void *local_8;
  
  pcVar2 = secp256k1_fe_impl_inv;
  if (in_EDX != 0) {
    pcVar2 = secp256k1_fe_impl_inv_var;
  }
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  (*pcVar2)(&local_40,in_RSI);
  if (local_8 != (void *)0x0) {
    memcpy(local_8,&local_40,0x28);
  }
  memcpy(&stack0xffffffffffffff70,local_10,0x28);
  iVar1 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)&stack0xffffffffffffff70);
  if (iVar1 == 0) {
    secp256k1_fe_impl_mul
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(secp256k1_fe *)0x1330b2);
    secp256k1_fe_impl_add((secp256k1_fe *)&stack0xffffffffffffff70,&fe_minus_one);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)&stack0xffffffffffffff70);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xd96,"test condition failed: secp256k1_fe_normalizes_to_zero(&t)");
      abort();
    }
    memcpy(&local_68,local_10,0x28);
    secp256k1_fe_impl_add(&local_68,&fe_minus_one);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_68);
    if (iVar1 == 0) {
      pcVar2 = secp256k1_fe_impl_inv;
      if (local_14 != 0) {
        pcVar2 = secp256k1_fe_impl_inv_var;
      }
      (*pcVar2)(&local_68);
      secp256k1_fe_impl_add(&local_40,&fe_minus_one);
      pcVar2 = secp256k1_fe_impl_inv;
      if (local_14 != 0) {
        pcVar2 = secp256k1_fe_impl_inv_var;
      }
      (*pcVar2)(&local_40);
      secp256k1_fe_impl_add_int(&local_40,1);
      secp256k1_fe_impl_add(&local_40,&local_68);
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_40);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0xd9f,"test condition failed: secp256k1_fe_normalizes_to_zero_var(&l)");
        abort();
      }
    }
  }
  else {
    iVar1 = secp256k1_fe_impl_normalizes_to_zero(&local_40);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0xd91,"test condition failed: secp256k1_fe_normalizes_to_zero(&l)");
      abort();
    }
  }
  return;
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}